

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O1

int __thiscall YdiskRestClient::copy(YdiskRestClient *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  ulong *puVar1;
  Response *pRVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  undefined8 extraout_RAX;
  Response *pRVar6;
  char *this_00;
  YdiskRestClient *this_01;
  pointer pcVar7;
  Client *this_02;
  shared_ptr<httplib::Response> sVar8;
  string empty_body;
  shared_ptr<httplib::Response> r;
  string url;
  ulong *local_c8;
  undefined8 local_c0;
  ulong local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [64];
  Headers *local_68 [2];
  Headers local_58;
  
  this_00 = "/v1/disk/resources/copy?from=";
  local_68[0] = &local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"/v1/disk/resources/copy?from=","");
  url_encode((string *)((long)&local_58._M_t._M_impl.super__Rb_tree_header._M_header + 8),
             (YdiskRestClient *)this_00,(string *)dst);
  this_01 = (YdiskRestClient *)0x15c105;
  plVar4 = (long *)std::__cxx11::string::append
                             ((char *)((long)&local_58._M_t._M_impl.super__Rb_tree_header._M_header
                                      + 8));
  pRVar2 = (Response *)(local_a8 + 0x10);
  pRVar6 = (Response *)(plVar4 + 2);
  if ((Response *)*plVar4 == pRVar6) {
    local_a8._16_8_ = (pRVar6->version)._M_dataplus._M_p;
    local_a8._24_8_ = plVar4[3];
    local_a8._0_8_ = pRVar2;
  }
  else {
    local_a8._16_8_ = (pRVar6->version)._M_dataplus._M_p;
    local_a8._0_8_ = (Response *)*plVar4;
  }
  local_a8._8_8_ = plVar4[1];
  *plVar4 = (long)pRVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  url_encode((string *)(local_a8 + 0x20),this_01,(string *)src);
  pcVar7 = (pointer)0xf;
  if ((Response *)local_a8._0_8_ != pRVar2) {
    pcVar7 = (pointer)local_a8._16_8_;
  }
  if (pcVar7 < (pointer)(local_a8._8_8_ + local_a8._40_8_)) {
    pcVar7 = (pointer)0xf;
    if ((undefined1 *)local_a8._32_8_ != local_a8 + 0x30) {
      pcVar7 = (pointer)local_a8._48_8_;
    }
    if (pcVar7 < (pointer)(local_a8._8_8_ + local_a8._40_8_)) goto LAB_0014085e;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)(local_a8 + 0x20),0,(char *)0x0,local_a8._0_8_);
  }
  else {
LAB_0014085e:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append(local_a8,local_a8._32_8_);
  }
  local_c8 = &local_b8;
  puVar1 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar1) {
    local_b8 = *puVar1;
    uStack_b0 = puVar5[3];
  }
  else {
    local_b8 = *puVar1;
    local_c8 = (ulong *)*puVar5;
  }
  local_c0 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  std::__cxx11::string::_M_append((char *)local_68,(ulong)local_c8);
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if ((undefined1 *)local_a8._32_8_ != local_a8 + 0x30) {
    operator_delete((void *)local_a8._32_8_,(ulong)(local_a8._48_8_ + 1));
  }
  if ((Response *)local_a8._0_8_ != pRVar2) {
    operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
  }
  if (local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
      (_Base_ptr)((long)&local_58._M_t._M_impl.super__Rb_tree_header._M_header + 0x18U)) {
    operator_delete(local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                    (ulong)((long)&(local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_right)
                                   ->_M_color + 1));
  }
  std::__cxx11::string::append((char *)local_68);
  std::__cxx11::string::append((char *)local_68);
  local_c0 = 0;
  local_b8 = local_b8 & 0xffffffffffffff00;
  this_02 = (Client *)local_a8;
  local_c8 = &local_b8;
  sVar8 = httplib::Client::Post
                    (this_02,(char *)this->http_client,local_68[0],(string *)&this->headers,
                     (char *)&local_c8);
  iVar3 = (int)sVar8.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((Response *)local_a8._0_8_ != (Response *)0x0) {
    if (*(int *)(local_a8._0_8_ + 0x20) != 0xc9) {
      if (((Response *)local_a8._0_8_ == (Response *)0x0) ||
         (*(int *)(local_a8._0_8_ + 0x20) != 0xca)) goto LAB_00140a1e;
      wait_success_operation(this,(string *)(local_a8._0_8_ + 0x58));
      iVar3 = extraout_EAX;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
      iVar3 = extraout_EAX_00;
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,local_b8 + 1);
      iVar3 = extraout_EAX_01;
    }
    if (local_68[0] != &local_58) {
      operator_delete(local_68[0],local_58._M_t._M_impl._0_8_ + 1);
      iVar3 = extraout_EAX_02;
    }
    return iVar3;
  }
LAB_00140a1e:
  throw_response_error((YdiskRestClient *)this_02,(Response *)local_a8._0_8_);
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if (local_68[0] != &local_58) {
    operator_delete(local_68[0],local_58._M_t._M_impl._0_8_ + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void YdiskRestClient::copy(std::string from, std::string to, BOOL overwrite)
{
    //TODO - max 'to' path is the 32760 symbols
    std::string url("/v1/disk/resources/copy?from=");
    url += url_encode(from) + "&path=" + url_encode(to);
    url += "&overwrite=";
    url += (overwrite == true ? "true": "false");
    std::string empty_body;
    auto r = http_client->Post(url.c_str(), headers, empty_body, "text/plain");

    if(r.get() && r->status==201){
        //success
        return;
    } else if(r.get() && r->status==202){
        //not empty folder is copying, get operation status
        wait_success_operation(r->body);
        return;
    } else {
        throw_response_error(r.get());
    }
}